

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O2

string * __thiscall
flatbuffers::Namer::Denamespace(string *__return_storage_ptr__,Namer *this,string *s,char delimiter)

{
  string prefix;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  local_28 = local_18;
  local_20 = 0;
  local_18[0] = 0;
  (*this->_vptr_Namer[0x15])();
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Denamespace(const std::string &s,
                                  const char delimiter = '.') const {
    std::string prefix;
    return Denamespace(s, prefix, delimiter);
  }